

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xchacha20.cpp
# Opt level: O0

void crypto::xchacha20::derive_subkey(char *key,char *nonce,char *subkey)

{
  word state [16];
  char *in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffb0;
  uint in_stack_ffffffffffffffb4;
  
  init_state((word *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
             in_stack_ffffffffffffffa8);
  util::endianness<util::little_endian>::load<unsigned_int>(in_stack_ffffffffffffffa8);
  util::endianness<util::little_endian>::load<unsigned_int>(in_stack_ffffffffffffffa8);
  util::endianness<util::little_endian>::load<unsigned_int>(in_stack_ffffffffffffffa8);
  util::endianness<util::little_endian>::load<unsigned_int>(in_stack_ffffffffffffffa8);
  run_rounds((word *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0));
  util::endianness<util::little_endian>::store<unsigned_int>
            (in_stack_ffffffffffffffb4,in_stack_ffffffffffffffa8);
  util::endianness<util::little_endian>::store<unsigned_int>
            (in_stack_ffffffffffffffb4,in_stack_ffffffffffffffa8);
  util::endianness<util::little_endian>::store<unsigned_int>
            (in_stack_ffffffffffffffb4,in_stack_ffffffffffffffa8);
  util::endianness<util::little_endian>::store<unsigned_int>
            (in_stack_ffffffffffffffb4,in_stack_ffffffffffffffa8);
  util::endianness<util::little_endian>::store<unsigned_int>
            (in_stack_ffffffffffffffb4,in_stack_ffffffffffffffa8);
  util::endianness<util::little_endian>::store<unsigned_int>
            (in_stack_ffffffffffffffb4,in_stack_ffffffffffffffa8);
  util::endianness<util::little_endian>::store<unsigned_int>
            (in_stack_ffffffffffffffb4,in_stack_ffffffffffffffa8);
  util::endianness<util::little_endian>::store<unsigned_int>
            (in_stack_ffffffffffffffb4,in_stack_ffffffffffffffa8);
  return;
}

Assistant:

void xchacha20::derive_subkey(const char key[key_size], const char nonce[16], char subkey[key_size]) {
	
	word state[16];
	init_state(state, key);
	state[12] = util::little_endian::load<word>(nonce);
	state[13] = util::little_endian::load<word>(nonce + 4);
	state[14] = util::little_endian::load<word>(nonce + 8);
	state[15] = util::little_endian::load<word>(nonce + 12);
	run_rounds(state);
	util::little_endian::store<word>(state[0], subkey);
	util::little_endian::store<word>(state[1], subkey + 4);
	util::little_endian::store<word>(state[2], subkey + 8);
	util::little_endian::store<word>(state[3], subkey + 12);
	util::little_endian::store<word>(state[12], subkey + 16);
	util::little_endian::store<word>(state[13], subkey + 20);
	util::little_endian::store<word>(state[14], subkey + 24);
	util::little_endian::store<word>(state[15], subkey + 28);
	
}